

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_sqrt_m68k(float32 xa,float_status *s)

{
  _Bool _Var1;
  int iVar2;
  float32 fVar3;
  bool bVar4;
  float fVar5;
  float local_44;
  union_float32 ur;
  union_float32 ua;
  float_status *s_local;
  float32 xa_local;
  float local_24;
  float_status *local_20;
  float *local_18;
  float local_c;
  
  bVar4 = false;
  if ((s->float_exception_flags & 0x20) != 0) {
    bVar4 = s->float_rounding_mode == '\0';
  }
  local_44 = (float)xa;
  _ur = s;
  s_local._0_4_ = xa;
  _xa_local = s;
  if (bVar4) {
    local_18 = &local_44;
    local_20 = s;
    if (s->flush_inputs_to_zero != '\0') {
      float32_input_flush__nocheck((float32 *)local_18,s);
    }
    local_c = local_44;
    _Var1 = float32_is_normal((float32)local_44);
    bVar4 = true;
    if (!_Var1) {
      iVar2 = float32_is_zero((float32)local_c);
      bVar4 = iVar2 != 0;
    }
    if (bVar4) {
      local_24 = local_44;
    }
    if (bVar4 && -1 < (int)local_44) {
      fVar5 = sqrtf(local_44);
      return (float32)fVar5;
    }
  }
  fVar3 = soft_f32_sqrt((float32)local_44,_ur);
  return fVar3;
}

Assistant:

float32 QEMU_FLATTEN float32_sqrt(float32 xa, float_status *s)
{
    union_float32 ua, ur;

    ua.s = xa;
    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float32_input_flush1(&ua.s, s);
    if (QEMU_HARDFLOAT_1F32_USE_FP) {
        if (unlikely(!(fpclassify(ua.h) == FP_NORMAL ||
                       fpclassify(ua.h) == FP_ZERO) ||
                     signbit(ua.h))) {
            goto soft;
        }
    } else if (unlikely(!float32_is_zero_or_normal(ua.s) ||
                        float32_is_neg(ua.s))) {
        goto soft;
    }
    ur.h = sqrtf(ua.h);
    return ur.s;

 soft:
    return soft_f32_sqrt(ua.s, s);
}